

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint generateFixedLitLenTree(HuffmanTree *tree)

{
  uint *puVar1;
  uint uVar2;
  uint *bitlen;
  long lVar3;
  
  bitlen = (uint *)malloc(0x480);
  if (bitlen == (uint *)0x0) {
    uVar2 = 0x53;
  }
  else {
    lVar3 = 0;
    do {
      puVar1 = bitlen + lVar3;
      *puVar1 = 8;
      puVar1[1] = 8;
      puVar1[2] = 8;
      puVar1[3] = 8;
      puVar1[4] = 8;
      puVar1[5] = 8;
      puVar1[6] = 8;
      puVar1[7] = 8;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x90);
    lVar3 = 0x90;
    do {
      puVar1 = bitlen + lVar3;
      *puVar1 = 9;
      puVar1[1] = 9;
      puVar1[2] = 9;
      puVar1[3] = 9;
      puVar1[4] = 9;
      puVar1[5] = 9;
      puVar1[6] = 9;
      puVar1[7] = 9;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x100);
    bitlen[0x100] = 7;
    bitlen[0x101] = 7;
    bitlen[0x102] = 7;
    bitlen[0x103] = 7;
    bitlen[0x104] = 7;
    bitlen[0x105] = 7;
    bitlen[0x106] = 7;
    bitlen[0x107] = 7;
    bitlen[0x108] = 7;
    bitlen[0x109] = 7;
    bitlen[0x10a] = 7;
    bitlen[0x10b] = 7;
    bitlen[0x10c] = 7;
    bitlen[0x10d] = 7;
    bitlen[0x10e] = 7;
    bitlen[0x10f] = 7;
    bitlen[0x110] = 7;
    bitlen[0x111] = 7;
    bitlen[0x112] = 7;
    bitlen[0x113] = 7;
    bitlen[0x114] = 7;
    bitlen[0x115] = 7;
    bitlen[0x116] = 7;
    bitlen[0x117] = 7;
    bitlen[0x118] = 8;
    bitlen[0x119] = 8;
    bitlen[0x11a] = 8;
    bitlen[0x11b] = 8;
    bitlen[0x11c] = 8;
    bitlen[0x11d] = 8;
    bitlen[0x11e] = 8;
    bitlen[0x11f] = 8;
    uVar2 = HuffmanTree_makeFromLengths(tree,bitlen,0x120,0xf);
    free(bitlen);
  }
  return uVar2;
}

Assistant:

static unsigned generateFixedLitLenTree(HuffmanTree* tree) {
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
  if (!bitlen) return 83; /*alloc fail*/

  /*288 possible codes: 0-255=literals, 256=endcode, 257-285=lengthcodes, 286-287=unused*/
  for (i = 0; i <= 143; ++i) bitlen[i] = 8;
  for (i = 144; i <= 255; ++i) bitlen[i] = 9;
  for (i = 256; i <= 279; ++i) bitlen[i] = 7;
  for (i = 280; i <= 287; ++i) bitlen[i] = 8;

  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DEFLATE_CODE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}